

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  TValue *pTVar7;
  lua_State *plVar8;
  TValue *pTVar9;
  lua_State *unaff_R14;
  
  plVar8 = (lua_State *)L->cframe;
  pTVar7 = L->base + -1;
  do {
    if (plVar8 == (lua_State *)0x0) goto LAB_00113c2e;
    iVar6 = *(int *)(((ulong)plVar8 & 0xfffffffffffffffc) + 0x10);
    if (iVar6 < 0) {
      pTVar9 = (TValue *)((ulong)(uint)-iVar6 + (ulong)(L->stack).ptr32);
      if (pTVar7 < pTVar9) {
        unaff_R14 = plVar8;
      }
      if (pTVar7 < pTVar9 && errcode != 0) {
        L->base = pTVar7 + 1;
        L->cframe = plVar8->cframe;
        unwindstack(L,pTVar9);
        unaff_R14 = plVar8;
      }
      iVar6 = 1;
      if (pTVar9 <= pTVar7) goto LAB_00113a9f;
      goto LAB_00113c21;
    }
LAB_00113a9f:
    iVar6 = 3;
    if (pTVar7 <= (TValue *)(ulong)(L->stack).ptr32) goto LAB_00113c21;
    uVar2 = (pTVar7->field_2).it;
    switch(uVar2 & 7) {
    default:
      pTVar7 = pTVar7 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
      goto LAB_00113c01;
    case 1:
switchD_00113aca_caseD_1:
      if (errcode == 0) {
        if (plVar8 != (lua_State *)stopcf) {
          plVar8 = (lua_State *)plVar8->cframe;
          goto switchD_00113aca_caseD_3;
        }
      }
      else {
        L->base = (TValue *)((long)pTVar7 + (8 - ((long)(int)uVar2 & 0xfffffffffffffff8U)));
        L->cframe = plVar8->cframe;
        unwindstack(L,pTVar7);
      }
      iVar6 = 1;
      unaff_R14 = (lua_State *)0x0;
      break;
    case 2:
      if (pTVar7[-1].u32.lo == 1) goto switchD_00113aca_caseD_1;
    case 3:
switchD_00113aca_caseD_3:
      pTVar7 = (TValue *)((long)pTVar7 - (long)(int)(uVar2 & 0xfffffff8));
LAB_00113c01:
      iVar6 = 0;
      break;
    case 5:
      iVar6 = 1;
      if (((ulong)plVar8 & 1) == 0) {
        unaff_R14 = plVar8;
        if (errcode != 0) {
          L->base = (TValue *)((long)pTVar7 + (8 - ((long)(int)uVar2 & 0xfffffffffffffff8U)));
          L->cframe = plVar8->cframe;
          unwindstack(L,pTVar7);
        }
      }
      else {
        unaff_R14 = plVar8;
        if (errcode != 0) {
          pbVar1 = (byte *)((ulong)(L->glref).ptr32 + 0x109);
          *pbVar1 = *pbVar1 & 0xef;
          L->cframe = (void *)0x0;
          L->status = (uint8_t)errcode;
        }
      }
      break;
    case 6:
    case 7:
      if (errcode != 0) {
        if (errcode == 1) {
          pTVar7 = (TValue *)((long)pTVar7 - (long)(int)(uVar2 & 0xfffffff8));
          bVar4 = false;
        }
        else {
          uVar5 = (ulong)(L->glref).ptr32;
          *(int *)(uVar5 + 0x188) = (int)L;
          if (((pTVar7->field_2).it & 7) == 6) {
            pbVar1 = (byte *)(uVar5 + 0x109);
            *pbVar1 = *pbVar1 & 0xef;
          }
          pTVar9 = (TValue *)
                   ((long)pTVar7 + (8 - ((long)(int)(pTVar7->field_2).it & 0xfffffffffffffff8U)));
          L->base = pTVar9;
          L->cframe = plVar8;
          unwindstack(L,pTVar9);
          bVar4 = true;
        }
        iVar6 = 0;
        if (!bVar4) break;
      }
      iVar6 = 1;
      unaff_R14 = (lua_State *)((ulong)plVar8 | 2);
    }
LAB_00113c21:
  } while (iVar6 == 0);
  if (iVar6 == 3) {
LAB_00113c2e:
    unaff_R14 = L;
    if (errcode != 0) {
      pTVar7 = (TValue *)((ulong)(L->stack).ptr32 + 8);
      L->base = pTVar7;
      L->cframe = (void *)0x0;
      unwindstack(L,pTVar7);
      pcVar3 = *(code **)((ulong)(L->glref).ptr32 + 0x178);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(L);
      }
      exit(1);
    }
  }
  return unaff_R14;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	global_State *g;
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	g = G(L);
	setgcref(g->cur_L, obj2gco(L));
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(g);
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}